

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O0

SourceRange __thiscall
slang::SourceManager::getExpansionRange(SourceManager *this,SourceLocation location)

{
  mutex_type *in_RDI;
  shared_lock<std::shared_mutex> lock;
  shared_lock<std::shared_mutex> *this_00;
  shared_lock<std::shared_mutex> *in_stack_ffffffffffffffb0;
  SourceManager *in_stack_ffffffffffffffb8;
  SourceLocation in_stack_ffffffffffffffc0;
  shared_lock<std::shared_mutex> local_30 [2];
  SourceRange local_10;
  
  this_00 = local_30;
  std::shared_lock<std::shared_mutex>::shared_lock(this_00,in_RDI);
  local_10 = getExpansionRangeImpl<std::shared_lock<std::shared_mutex>_>
                       (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc0,
                        in_stack_ffffffffffffffb0);
  std::shared_lock<std::shared_mutex>::~shared_lock(this_00);
  return local_10;
}

Assistant:

SourceRange SourceManager::getExpansionRange(SourceLocation location) const {
    std::shared_lock<std::shared_mutex> lock(mutex);
    return getExpansionRangeImpl(location, lock);
}